

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_33808::
ARTCorrectnessTest_Node16KeyInsertOrderDescending_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTCorrectnessTest_Node16KeyInsertOrderDescending_Test
          (ARTCorrectnessTest_Node16KeyInsertOrderDescending_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, Node16KeyInsertOrderDescending) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert(5, unodb::test::test_values[0]);
  verifier.insert(4, unodb::test::test_values[1]);
  verifier.insert(3, unodb::test::test_values[2]);
  verifier.insert(2, unodb::test::test_values[3]);
  verifier.insert(1, unodb::test::test_values[4]);
  verifier.insert(0, unodb::test::test_values[0]);

  verifier.check_present_values();
  verifier.check_absent_keys({6});

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_node_counts({6, 0, 1, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
}